

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

FilePathSpecSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::FilePathSpecSyntax,slang::syntax::FilePathSpecSyntax_const&>
          (BumpAllocator *this,FilePathSpecSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  FilePathSpecSyntax *pFVar8;
  
  pFVar8 = (FilePathSpecSyntax *)allocate(this,0x28,8);
  uVar3 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar4 = (args->path).kind;
  uVar5 = (args->path).field_0x2;
  NVar6.raw = (args->path).numFlags.raw;
  uVar7 = (args->path).rawLen;
  (pFVar8->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pFVar8->super_SyntaxNode).field_0x4 = uVar3;
  (pFVar8->super_SyntaxNode).parent = pSVar1;
  (pFVar8->super_SyntaxNode).previewNode = pSVar2;
  (pFVar8->path).kind = TVar4;
  (pFVar8->path).field_0x2 = uVar5;
  (pFVar8->path).numFlags = (NumericTokenFlags)NVar6.raw;
  (pFVar8->path).rawLen = uVar7;
  (pFVar8->path).info = (args->path).info;
  return pFVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }